

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UBool ucurr_isAvailable_63(UChar *isoCode,UDate from,UDate to,UErrorCode *eErrorCode)

{
  UBool UVar1;
  void *pvVar2;
  IsoCodeEntry *result;
  UErrorCode *eErrorCode_local;
  UDate to_local;
  UDate from_local;
  UChar *isoCode_local;
  
  icu_63::umtx_initOnce(&gIsoCodesInitOnce,initIsoCodes,eErrorCode);
  UVar1 = U_FAILURE(*eErrorCode);
  if (UVar1 == '\0') {
    pvVar2 = uhash_get_63(gIsoCodes,isoCode);
    if (pvVar2 == (void *)0x0) {
      isoCode_local._7_1_ = '\0';
    }
    else if (from <= to) {
      if ((*(double *)((long)pvVar2 + 0x10) <= from && from != *(double *)((long)pvVar2 + 0x10)) ||
         (to < *(double *)((long)pvVar2 + 8))) {
        isoCode_local._7_1_ = '\0';
      }
      else {
        isoCode_local._7_1_ = '\x01';
      }
    }
    else {
      *eErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      isoCode_local._7_1_ = '\0';
    }
  }
  else {
    isoCode_local._7_1_ = '\0';
  }
  return isoCode_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucurr_isAvailable(const UChar* isoCode, UDate from, UDate to, UErrorCode* eErrorCode) {
    umtx_initOnce(gIsoCodesInitOnce, &initIsoCodes, *eErrorCode);
    if (U_FAILURE(*eErrorCode)) {
        return FALSE;
    }

    IsoCodeEntry* result = (IsoCodeEntry *) uhash_get(gIsoCodes, isoCode);
    if (result == NULL) {
        return FALSE;
    } else if (from > to) {
        *eErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    } else if  ((from > result->to) || (to < result->from)) {
        return FALSE;
    }
    return TRUE;
}